

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

void __thiscall ymfm::opll_base::generate(opll_base *this,output_data *output,uint32_t numsamples)

{
  ymfm_output<2> *output_00;
  uint local_20;
  uint32_t samp;
  uint32_t numsamples_local;
  output_data *output_local;
  opll_base *this_local;
  
  _samp = output;
  for (local_20 = 0; local_20 < numsamples; local_20 = local_20 + 1) {
    fm_engine_base<ymfm::opll_registers>::clock(&this->m_fm);
    output_00 = ymfm_output<2>::clear(_samp);
    fm_engine_base<ymfm::opll_registers>::output(&this->m_fm,output_00,5,0x100,0x1ff);
    _samp->data[0] = (_samp->data[0] << 7) / 9;
    _samp->data[1] = (_samp->data[1] << 7) / 9;
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void opll_base::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// update the FM content; OPLL has a built-in 9-bit DAC
		m_fm.output(output->clear(), 5, 256, fm_engine::ALL_CHANNELS);

		// final output is multiplexed; we don't simulate that here except
		// to average over everything
		output->data[0] = (output->data[0] * 128) / 9;
		output->data[1] = (output->data[1] * 128) / 9;
	}
}